

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

int ON_ScaleValue::Compare(ON_ScaleValue *lhs,ON_ScaleValue *rhs)

{
  ON_SHA1_Hash local_58;
  ON_SHA1_Hash local_44;
  double local_30;
  double y;
  double x;
  ON_ScaleValue *rhs_local;
  ON_ScaleValue *lhs_local;
  
  x = (double)rhs;
  rhs_local = lhs;
  y = RightToLeftScale(lhs);
  local_30 = RightToLeftScale((ON_ScaleValue *)x);
  if (local_30 <= y) {
    if (y <= local_30) {
      ContentHash(&local_44,rhs_local);
      ContentHash(&local_58,(ON_ScaleValue *)x);
      lhs_local._4_4_ = ON_SHA1_Hash::Compare(&local_44,&local_58);
    }
    else {
      lhs_local._4_4_ = 1;
    }
  }
  else {
    lhs_local._4_4_ = -1;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_ScaleValue::Compare(
  const ON_ScaleValue& lhs,
  const ON_ScaleValue& rhs
)
{
  double x = lhs.RightToLeftScale();
  double y = rhs.RightToLeftScale();
  if (x < y)
    return -1;
  if (x > y)
    return 1;
  return ON_SHA1_Hash::Compare(lhs.ContentHash(), rhs.ContentHash());
}